

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

int syms_inc_scope(void)

{
  symtbl_t **ppsVar1;
  symtbl_t *psVar2;
  int iVar3;
  uint uVar4;
  
  psVar2 = scope;
  uVar4 = scope->num_children + 1;
  scope->num_children = uVar4;
  ppsVar1 = (symtbl_t **)mrealloc(psVar2->children,(ulong)uVar4 << 3);
  scope->children = ppsVar1;
  psVar2 = (symtbl_t *)mmalloc(0x28);
  iVar3 = scope_id + 1;
  scope_id = iVar3;
  psVar2->scope_id = iVar3;
  psVar2->parent = scope;
  psVar2->num_syms = 0;
  psVar2->num_children = 0;
  psVar2->syms = (sym_t **)0x0;
  psVar2->children = (symtbl_t **)0x0;
  scope->children[scope->num_children - 1] = psVar2;
  scope = psVar2;
  return iVar3;
}

Assistant:

int syms_inc_scope()
{
    symtbl_t* new;
    scope->num_children++;
    scope->children = (symtbl_t**)mrealloc(scope->children,
                                           sizeof(symtbl_t*) * scope->num_children);
    new = (symtbl_t*)mmalloc(sizeof(symtbl_t));

    ++scope_id;
    cur_scope_id = scope_id;

    new->scope_id = scope_id;
    new->parent = scope;
    new->num_syms = 0;
    new->num_children = 0;
    new->syms = NULL;
    new->children = NULL;

    scope->children[scope->num_children - 1] = new;
    scope = new;

    return cur_scope_id;
}